

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O2

bool __thiscall
nuraft::snapshot_io_mgr::push
          (snapshot_io_mgr *this,ptr<raft_server> *r,ptr<peer> *p,
          function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
          *h)

{
  bool bVar1;
  ptr<io_queue_elem> elem;
  undefined1 auStack_58 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  peer::get_snapshot_sync_ctx((peer *)(auStack_58 + 0x20));
  peer::get_snapshot_sync_ctx((peer *)auStack_58);
  std::
  make_shared<nuraft::snapshot_io_mgr::io_queue_elem,std::shared_ptr<nuraft::raft_server>&,std::shared_ptr<nuraft::snapshot>const&,std::shared_ptr<nuraft::snapshot_sync_ctx>,std::shared_ptr<nuraft::peer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&>
            ((shared_ptr<nuraft::raft_server> *)(auStack_58 + 0x10),
             (shared_ptr<nuraft::snapshot> *)r,
             (shared_ptr<nuraft::snapshot_sync_ctx> *)(auStack_58._32_8_ + 8),
             (shared_ptr<nuraft::peer> *)auStack_58,
             (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
              *)p);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  bVar1 = push(this,(ptr<snapshot_io_mgr::io_queue_elem> *)(auStack_58 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 0x18));
  return bVar1;
}

Assistant:

bool snapshot_io_mgr::push(ptr<raft_server> r,
                           ptr<peer> p,
                           std::function< void(ptr<resp_msg>&, ptr<rpc_exception>&) >& h)
{
    ptr<io_queue_elem> elem =
        cs_new<io_queue_elem>( r,
                               p->get_snapshot_sync_ctx()->get_snapshot(),
                               p->get_snapshot_sync_ctx(),
                               p,
                               h );
    return push(elem);
}